

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_api.cpp
# Opt level: O0

void __thiscall cppcms::impl::cgi::http::async_read_headers(http *this,handler *h)

{
  http *in_RSI;
  long in_RDI;
  http *in_stack_00000030;
  handler *in_stack_00000078;
  http *in_stack_00000080;
  
  update_time(in_RSI);
  add_to_watchdog(in_stack_00000030);
  *(undefined4 *)(in_RDI + 0x254) = 0;
  async_read_some_headers(in_stack_00000080,in_stack_00000078);
  return;
}

Assistant:

virtual void async_read_headers(handler const &h)
		{
			#ifdef CPPCMS_NO_SO_SNDTIMO
			booster::system::error_code e;
			socket_.set_non_blocking_if_needed(true,e);
			if(e) { h(e); return; }
			#endif
			update_time();
			add_to_watchdog();
			total_read_ = 0;
			async_read_some_headers(h);
		}